

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

int __thiscall lzham::lzham_decompressor::init(lzham_decompressor *this,EVP_PKEY_CTX *ctx)

{
  uint in_stack_0000000c;
  CLZDecompBase *in_stack_00000010;
  
  CLZDecompBase::init_position_slots(in_stack_00000010,in_stack_0000000c);
  this->m_state = 0;
  this->m_step = 0;
  this->m_block_step = 0;
  this->m_block_index = 0;
  this->m_initial_step = 0;
  this->m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
  this->m_dst_ofs = 0;
  this->m_pIn_buf = (uint8 *)0x0;
  this->m_pIn_buf_size = (size_t *)0x0;
  this->m_pOut_buf = (uint8 *)0x0;
  this->m_pOut_buf_size = (size_t *)0x0;
  this->m_no_more_input_bytes_flag = false;
  this->m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
  this->m_pOrig_out_buf = (uint8 *)0x0;
  this->m_orig_out_buf_size = 0;
  this->m_decomp_adler32 = 1;
  return (int)this;
}

Assistant:

void lzham_decompressor::init()
   {
      m_lzBase.init_position_slots(m_params.m_dict_size_log2);

#ifdef LZHAM_LZDEBUG
      if (m_pDecomp_buf)
         memset(m_pDecomp_buf, 0xCE, 1U << m_params.m_dict_size_log2);
#endif

      m_state = LZHAM_CR_INITIAL_STATE;
      m_step = 0;
      m_block_step = 0;
      m_block_index = 0;
      m_initial_step = 0;

      m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
      
      m_dst_ofs = 0;

      m_pIn_buf = NULL;
      m_pIn_buf_size = NULL;
      m_pOut_buf = NULL;
      m_pOut_buf_size = NULL;
      m_no_more_input_bytes_flag = false;
      m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
      m_pOrig_out_buf = NULL;
      m_orig_out_buf_size = 0;
      m_decomp_adler32 = cInitAdler32;
   }